

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int decodeFlags(MemPage *pPage,int flagByte)

{
  BtShared *pBVar1;
  int iVar2;
  u8 uVar3;
  code *pcVar4;
  long lVar5;
  code *pcVar6;
  long lVar7;
  bool bVar8;
  
  uVar3 = (u8)((uint)flagByte >> 3);
  pPage->leaf = uVar3;
  pPage->childPtrSize = '\x04' - (char)(((uint)flagByte >> 3) << 2);
  pBVar1 = pPage->pBt;
  if ((flagByte & 0xfffffff7U) == 2) {
    pPage->intKey = '\0';
    lVar5 = 0x2c;
    lVar7 = 0x2a;
    pcVar6 = btreeParseCellPtrIndex;
    pcVar4 = cellSizePtr;
    bVar8 = false;
  }
  else {
    if ((flagByte & 0xfffffff7U) != 5) {
      pPage->intKey = '\0';
      pPage->intKeyLeaf = '\0';
      pPage->xCellSize = cellSizePtr;
      pPage->xParseCell = btreeParseCellPtrIndex;
      iVar2 = sqlite3CorruptError(0x1118f);
      return iVar2;
    }
    pPage->intKey = '\x01';
    bVar8 = uVar3 != '\0';
    pcVar4 = cellSizePtrNoPayload;
    if (bVar8) {
      pcVar4 = cellSizePtrTableLeaf;
    }
    pcVar6 = btreeParseCellPtrNoPayload;
    if (bVar8) {
      pcVar6 = btreeParseCellPtr;
    }
    lVar5 = 0x30;
    lVar7 = 0x2e;
  }
  pPage->intKeyLeaf = bVar8;
  pPage->xCellSize = pcVar4;
  pPage->xParseCell = pcVar6;
  pPage->maxLocal = *(u16 *)((long)&pBVar1->pPager + lVar7);
  pPage->minLocal = *(u16 *)((long)&pBVar1->pPager + lVar5);
  pPage->max1bytePayload = pBVar1->max1bytePayload;
  return 0;
}

Assistant:

static int decodeFlags(MemPage *pPage, int flagByte){
  BtShared *pBt;     /* A copy of pPage->pBt */

  assert( pPage->hdrOffset==(pPage->pgno==1 ? 100 : 0) );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  pPage->leaf = (u8)(flagByte>>3);  assert( PTF_LEAF == 1<<3 );
  flagByte &= ~PTF_LEAF;
  pPage->childPtrSize = 4-4*pPage->leaf;
  pBt = pPage->pBt;
  if( flagByte==(PTF_LEAFDATA | PTF_INTKEY) ){
    /* EVIDENCE-OF: R-07291-35328 A value of 5 (0x05) means the page is an
    ** interior table b-tree page. */
    assert( (PTF_LEAFDATA|PTF_INTKEY)==5 );
    /* EVIDENCE-OF: R-26900-09176 A value of 13 (0x0d) means the page is a
    ** leaf table b-tree page. */
    assert( (PTF_LEAFDATA|PTF_INTKEY|PTF_LEAF)==13 );
    pPage->intKey = 1;
    if( pPage->leaf ){
      pPage->intKeyLeaf = 1;
      pPage->xCellSize = cellSizePtrTableLeaf;
      pPage->xParseCell = btreeParseCellPtr;
    }else{
      pPage->intKeyLeaf = 0;
      pPage->xCellSize = cellSizePtrNoPayload;
      pPage->xParseCell = btreeParseCellPtrNoPayload;
    }
    pPage->maxLocal = pBt->maxLeaf;
    pPage->minLocal = pBt->minLeaf;
  }else if( flagByte==PTF_ZERODATA ){
    /* EVIDENCE-OF: R-43316-37308 A value of 2 (0x02) means the page is an
    ** interior index b-tree page. */
    assert( (PTF_ZERODATA)==2 );
    /* EVIDENCE-OF: R-59615-42828 A value of 10 (0x0a) means the page is a
    ** leaf index b-tree page. */
    assert( (PTF_ZERODATA|PTF_LEAF)==10 );
    pPage->intKey = 0;
    pPage->intKeyLeaf = 0;
    pPage->xCellSize = cellSizePtr;
    pPage->xParseCell = btreeParseCellPtrIndex;
    pPage->maxLocal = pBt->maxLocal;
    pPage->minLocal = pBt->minLocal;
  }else{
    /* EVIDENCE-OF: R-47608-56469 Any other value for the b-tree page type is
    ** an error. */
    pPage->intKey = 0;
    pPage->intKeyLeaf = 0;
    pPage->xCellSize = cellSizePtr;
    pPage->xParseCell = btreeParseCellPtrIndex;
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  pPage->max1bytePayload = pBt->max1bytePayload;
  return SQLITE_OK;
}